

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laser_tag.cpp
# Opt level: O1

bool __thiscall
despot::LaserTag::Step
          (LaserTag *this,State *state,double random_num,ACT_TYPE action,double *reward,
          OBS_TYPE *obs)

{
  int iVar1;
  pointer pvVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  byte bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  Random random;
  Random local_3c [4];
  double local_38;
  
  despot::Random::Random(local_3c,random_num);
  dVar10 = (double)despot::Random::NextDouble();
  bVar4 = BaseTag::Step(&this->super_BaseTag,state,dVar10,action,reward);
  if ((bVar4) ||
     (iVar1 = *(int *)(state + 0xc),
     (this->super_BaseTag).rob_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start[iVar1] ==
     (this->super_BaseTag).opp_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start[iVar1])) {
    *obs = (this->super_BaseTag).same_loc_obs_;
  }
  else {
    pvVar2 = (this->reading_distributions_).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *obs = 0;
    if (0 < NBEAMS) {
      lVar9 = 0;
      local_38 = Globals::TINY;
      do {
        dVar10 = (double)despot::Random::NextDouble();
        lVar5 = *(long *)&pvVar2[iVar1].
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        lVar3 = *(long *)(lVar5 + lVar9 * 0x18);
        lVar5 = *(long *)(lVar5 + 8 + lVar9 * 0x18) - lVar3;
        if (lVar5 == 0) {
          lVar8 = 0;
        }
        else {
          lVar5 = lVar5 >> 3;
          lVar5 = lVar5 + (ulong)(lVar5 == 0);
          lVar7 = 0;
          do {
            dVar10 = dVar10 - *(double *)(lVar3 + lVar7 * 8);
            lVar8 = lVar7;
            if (dVar10 < local_38) break;
            lVar7 = lVar7 + 1;
            lVar8 = lVar5;
          } while (lVar5 != lVar7);
        }
        bVar6 = (char)lVar9 * (byte)BITS_PER_READING;
        *obs = lVar8 << (bVar6 & 0x3f) |
               ~(~(-1L << ((byte)BITS_PER_READING & 0x3f)) << (bVar6 & 0x3f)) & *obs;
        lVar9 = lVar9 + 1;
      } while (lVar9 < NBEAMS);
    }
  }
  return bVar4;
}

Assistant:

bool LaserTag::Step(State& state, double random_num, ACT_TYPE action, double& reward,
	OBS_TYPE& obs) const {
	Random random(random_num);
	bool terminal = BaseTag::Step(state, random.NextDouble(), action, reward);

	if (terminal) {
		obs = same_loc_obs_;
	} else {
		if (rob_[state.state_id] == opp_[state.state_id])
			obs = same_loc_obs_;
		else {
			const vector<vector<double> >& distribution = reading_distributions_[state.state_id];

			obs = 0;
			for (int dir = 0; dir < NBEAMS; dir++) {
				double mass = random.NextDouble();
				int reading = 0;
				for (; reading < distribution[dir].size(); reading++) {
					mass -= distribution[dir][reading];
					if (mass < Globals::TINY)
						break;
				}
				SetReading(obs, reading, dir);
			}
		}
	}

	return terminal;
}